

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWMeshVertexData.h
# Opt level: O3

void __thiscall COLLADAFW::MeshVertexData::~MeshVertexData(MeshVertexData *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  InputInfos *pIVar2;
  pointer pcVar3;
  ulong uVar4;
  
  (this->super_FloatOrDoubleArray).super_Animatable._vptr_Animatable =
       (_func_int **)&PTR__MeshVertexData_009b66a0;
  if ((this->mInputInfosArray).mCount != 0) {
    uVar4 = 0;
    do {
      pIVar2 = (this->mInputInfosArray).mData[uVar4];
      if (pIVar2 != (InputInfos *)0x0) {
        pcVar3 = (pIVar2->mName)._M_dataplus._M_p;
        paVar1 = &(pIVar2->mName).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
      }
      operator_delete(pIVar2,0x30);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (this->mInputInfosArray).mCount);
  }
  free((this->mInputInfosArray).mData);
  (this->mInputInfosArray).mData = (InputInfos **)0x0;
  (this->mInputInfosArray).mCount = 0;
  (this->mInputInfosArray).mCapacity = 0;
  FloatOrDoubleArray::~FloatOrDoubleArray(&this->super_FloatOrDoubleArray);
  return;
}

Assistant:

virtual ~MeshVertexData()
        {
            for ( size_t i=0; i<mInputInfosArray.getCount(); ++i )
            {
                delete mInputInfosArray [i];
            }
            mInputInfosArray.releaseMemory ();
        }